

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  BOOL BVar4;
  BOOL BVar5;
  int iVar6;
  AP_LOG_LEVEL AVar7;
  uint uVar8;
  FILE *pFVar9;
  undefined8 *puVar10;
  char *pcVar11;
  size_t sVar12;
  ulong uVar13;
  int *piVar14;
  uint uVar15;
  char **ppcVar16;
  char *pcVar17;
  char *pcVar18;
  long *plVar19;
  size_t sStack_4b0;
  AP_CTX local_498;
  uint32_t network;
  uint32_t ip;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438 [129];
  
  if (argv == (char **)0x0) {
    fwrite("Invalid argument: argv\n",0x17,1,_stdout);
    uVar8 = 3;
  }
  else {
    local_498.client_ip = (char *)0x0;
    local_498.client_command = (char *)0x0;
    local_498.log_file = (FILE *)0x0;
    local_498.simulate = '\0';
    local_498._41_7_ = 0;
    local_498.config_file = (FILE *)0x0;
    local_498.log_path = (char *)0x0;
    local_498.default_dir = (char *)0x0;
    local_498.config_path = (char *)0x0;
    ap_log_init();
    if (argc != 1) {
      if (argc != 0) {
        if (argc < 9) {
          uVar8 = 4;
          ppcVar16 = argv + 1;
          BVar4 = '\0';
          pcVar18 = (char *)0x0;
LAB_00102348:
          BVar5 = BVar4;
          ppcVar16 = ppcVar16 + 1;
          do {
            pcVar17 = ppcVar16[-1];
            if (pcVar17 == (char *)0x0) {
              local_498.simulate = BVar5;
              if (pcVar18 == (char *)0x0) goto LAB_0010244b;
              pcVar17 = (char *)0x0;
              goto LAB_0010252b;
            }
            if (*pcVar17 != '-') goto switchD_0010237c_caseD_64;
            bVar1 = pcVar17[1];
            if (9 < bVar1 - 99) {
              if (bVar1 == 0x73) {
                BVar4 = '\x01';
                if (pcVar17[2] == '\0') goto LAB_00102348;
                goto switchD_0010237c_caseD_64;
              }
              if (bVar1 != 0x76) goto switchD_0010237c_caseD_64;
              local_498.simulate = BVar5;
              if (pcVar17[2] != '\0') goto LAB_00102803;
              uVar15 = 0;
              fprintf(_stdout,"\nauthprogs %d.%d.%d\n",0,9,0xc9);
              goto LAB_0010292f;
            }
            pcVar11 = *ppcVar16;
            switch((uint)bVar1) {
            case 99:
              if (pcVar17[2] != '\0') goto switchD_0010237c_caseD_64;
              if (pcVar11 == (char *)0x0) goto LAB_00102880;
              local_498.config_path = strdup(pcVar11);
              if (local_498.config_path == (char *)0x0) {
                pcVar18 = "Cannot allocate memory for \'ctx->config_path\'\n";
                sStack_4b0 = 0x2e;
                goto LAB_0010298c;
              }
              break;
            default:
              goto switchD_0010237c_caseD_64;
            case 0x65:
              if (pcVar17[2] != '\0') goto switchD_0010237c_caseD_64;
              if (pcVar11 == (char *)0x0) goto LAB_00102880;
              sVar12 = strlen(pcVar11);
              if ((sVar12 != 1) || ((byte)(*pcVar11 - 0x36U) < 0xfa)) {
                local_498.simulate = BVar5;
                pcVar18 = "Invalid log level \'%s\'\n";
                goto LAB_001028b1;
              }
              ap_log_set_level((uint)(byte)(*pcVar11 - 0x30));
              break;
            case 0x68:
              local_498.simulate = BVar5;
              if (pcVar17[2] != '\0') goto LAB_00102803;
              show_help();
              uVar15 = 0;
              goto LAB_0010292f;
            case 0x6c:
              goto switchD_0010237c_caseD_6c;
            }
            ppcVar16 = ppcVar16 + 2;
          } while( true );
        }
        fwrite("Too many arguments\n",0x13,1,_stdout);
        goto LAB_001028b8;
      }
      fwrite("argv[0] is missing\n",0x13,1,_stdout);
      goto LAB_001028bd;
    }
LAB_0010244b:
    uVar8 = get_default_directory(&local_498);
    pcVar17 = local_498.default_dir;
    if ((uVar8 == 0) && (uVar8 = create_directory(local_498.default_dir), uVar8 == 0)) {
      sVar12 = strlen(pcVar17);
      sVar12 = sVar12 + 0x11;
      pcVar18 = (char *)calloc(1,sVar12);
      local_498.log_path = pcVar18;
      if (pcVar18 == (char *)0x0) {
        ap_log(AP_LOG_LEVEL_ERROR,"Can not allocate memory for \'ctx->log_path\'\n");
LAB_001029ab:
        uVar8 = 4;
      }
      else {
        ap_str_strlcpy(pcVar18,pcVar17,sVar12);
        ap_str_strlcat(pcVar18,"/",sVar12);
        ap_str_strlcat(pcVar18,"authprogs.log",sVar12);
LAB_0010252b:
        iVar6 = strcmp(pcVar18,"stdout");
        if (iVar6 == 0) {
          puVar10 = (undefined8 *)&stdout;
LAB_001025a7:
          pFVar9 = (FILE *)*puVar10;
        }
        else {
          iVar6 = strcmp(pcVar18,"stderr");
          if (iVar6 == 0) {
            puVar10 = (undefined8 *)&stderr;
            goto LAB_001025a7;
          }
          pFVar9 = fopen(pcVar18,"at");
          local_498.log_file = (FILE *)pFVar9;
          if (pFVar9 == (FILE *)0x0) {
            piVar14 = __errno_location();
            pcVar17 = strerror(*piVar14);
            ap_log(AP_LOG_LEVEL_ERROR,"Can not open log file \'%s\', error: \'%s\'\n",pcVar18,
                   pcVar17);
            uVar8 = 8;
            goto LAB_00102911;
          }
        }
        ap_log_set_output((FILE *)pFVar9);
        local_438[0] = (char *)0x0;
        pcVar18 = getenv("SSH_CLIENT");
        if (pcVar18 == (char *)0x0) {
          pcVar18 = "Can not get SSH_CLIENT environment variable\n";
LAB_001028fa:
          ap_log(AP_LOG_LEVEL_ERROR,pcVar18);
          uVar8 = 6;
        }
        else {
          if (*pcVar18 == '\0') {
            pcVar18 = "Empty SSH_CLIENT environment variable\n";
            goto LAB_001028fa;
          }
          pcVar18 = strdup(pcVar18);
          local_498.client_ip = pcVar18;
          if (pcVar18 != (char *)0x0) {
            pcVar11 = strtok_r(pcVar18," \t",local_438);
            if (pcVar11 != (char *)0x0) {
              uVar15 = 6;
              local_438[0] = (char *)0x0;
              pcVar11 = getenv("SSH_ORIGINAL_COMMAND");
              if (pcVar11 == (char *)0x0) {
                pcVar17 = "(%s) Can not get SSH_ORIGINAL_COMMAND environment variable\n";
              }
              else if (*pcVar11 == '\0') {
                pcVar17 = "(%s) Empty SSH_ORIGINAL_COMMAND environment variable\n";
              }
              else {
                uVar15 = 4;
                ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Client command \'%s\'\n",pcVar18,pcVar11);
                AVar7 = ap_log_get_level();
                if (AVar7 == AP_LOG_LEVEL_TRACE) {
                  uVar8 = ap_str_to_hex(pcVar11,local_438);
                  if (uVar8 != 0) goto LAB_00102870;
                  ap_log(AP_LOG_LEVEL_TRACE,"(%s) Client command in hexadecimal \'%s\'\n",pcVar18,
                         local_438[0]);
                  free(local_438[0]);
                }
                pcVar11 = strdup(pcVar11);
                local_498.client_command = pcVar11;
                if (pcVar11 != (char *)0x0) {
                  ap_str_trim_head_from_set(pcVar11," \t");
                  ap_str_trim_tail_from_set(pcVar11," \t\r\n");
                  ap_str_shrink_spaces(pcVar11);
                  pcVar18 = local_498.config_path;
                  if (local_498.config_path == (char *)0x0) {
                    if ((pcVar17 == (char *)0x0) &&
                       ((uVar8 = get_default_directory(&local_498), pcVar17 = local_498.default_dir,
                        uVar8 != 0 || (uVar8 = create_directory(local_498.default_dir), uVar8 != 0))
                       )) goto LAB_00102870;
                    sVar12 = strlen(pcVar17);
                    sVar12 = sVar12 + 0x12;
                    pcVar18 = (char *)calloc(1,sVar12);
                    local_498.config_path = pcVar18;
                    if (pcVar18 == (char *)0x0) {
                      ap_log(AP_LOG_LEVEL_ERROR,
                             "(%s) Can not allocate memory for \'ctx->config_path\'\n",
                             local_498.client_ip);
                      goto LAB_001029ab;
                    }
                    ap_str_strlcpy(pcVar18,pcVar17,sVar12);
                    ap_str_strlcat(pcVar18,"/",sVar12);
                    ap_str_strlcat(pcVar18,"authprogs.conf",sVar12);
                  }
                  pFVar9 = fopen(pcVar18,"rt");
                  pcVar17 = local_498.client_ip;
                  pcVar18 = local_498.config_path;
                  local_498.config_file = (FILE *)pFVar9;
                  if (pFVar9 != (FILE *)0x0) {
                    AVar7 = ap_log_get_level();
                    pcVar18 = local_498.client_ip;
                    if (AVar7 == AP_LOG_LEVEL_TRACE) {
                      if (_environ == (long *)0x0) {
                        pcVar17 = "(%s) Can not get environment\n";
                      }
                      else {
                        pcVar17 = "(%s) +------------------------------------+\n";
                        ap_log(AP_LOG_LEVEL_TRACE,"(%s) +------------------------------------+\n",
                               local_498.client_ip);
                        ap_log(AP_LOG_LEVEL_TRACE,"(%s) |          ENVIRONMENT START         |\n",
                               pcVar18);
                        ap_log(AP_LOG_LEVEL_TRACE,"(%s) +------------------------------------+\n",
                               pcVar18);
                        for (plVar19 = _environ; *plVar19 != 0; plVar19 = plVar19 + 1) {
                          ap_log(AP_LOG_LEVEL_TRACE,"(%s) | %s\n",pcVar18);
                        }
                        ap_log(AP_LOG_LEVEL_TRACE,"(%s) +------------------------------------+\n",
                               pcVar18);
                        ap_log(AP_LOG_LEVEL_TRACE,"(%s) |          ENVIRONMENT END           |\n",
                               pcVar18);
                      }
                      ap_log(AP_LOG_LEVEL_TRACE,pcVar17,pcVar18);
                    }
                    pcVar17 = local_498.client_command;
LAB_00102a01:
                    bVar3 = false;
LAB_00102a07:
                    do {
                      do {
                        while( true ) {
                          do {
                            pcVar11 = fgets((char *)local_438,0x400,pFVar9);
                            if (pcVar11 == (char *)0x0) {
                              uVar15 = 0;
                              ap_log(AP_LOG_LEVEL_DENIED_COMMAND,
                                     "(%s) Is not allowed to execute command \'%s\'\n",pcVar18,
                                     pcVar17);
                              fprintf(_stderr,"(%s) Is not allowed to execute command \'%s\'\n",
                                      pcVar18,pcVar17);
                              goto LAB_0010292f;
                            }
                            pcVar11 = ap_str_trim_head_from_set((char *)local_438," \t");
                            ap_str_trim_tail_from_set(pcVar11," \t\r\n");
                            ap_str_shrink_spaces(pcVar11);
                            ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Parsing line \'%s\'\n",pcVar18,pcVar11);
                            sVar12 = strlen(pcVar11);
                            cVar2 = *pcVar11;
                          } while ((cVar2 == '#') || (sVar12 == 0 || cVar2 == ';'));
                          if (cVar2 != '[') break;
                          if (pcVar11[sVar12 - 1] == ']') {
                            local_440 = (char *)0x0;
                            sVar12 = strlen(pcVar11);
                            pcVar11[sVar12 - 1] = '\0';
                            pcVar11 = ap_str_trim_from_set(pcVar11 + 1," \t");
                            ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Parsing ip list \'%s\'\n",pcVar18,
                                   pcVar11);
                            local_450 = pcVar17;
                            while( true ) {
                              pcVar17 = local_450;
                              pcVar11 = strtok_r(pcVar11," \t",&local_440);
                              if (pcVar11 == (char *)0x0) goto LAB_00102a01;
                              ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Token \'%s\'\n",pcVar18,pcVar11);
                              ap_log(AP_LOG_LEVEL_DEBUG,"(%s) IP \'%s\'\n",pcVar18,pcVar11);
                              if (((*pcVar11 == 'A') && (pcVar11[1] == 'L')) && (pcVar11[2] == 'L'))
                              break;
                              local_448 = (char *)0x0;
                              pcVar17 = strtok_r(pcVar11,"/",&local_448);
                              if (pcVar17 == (char *)0x0) {
                                ap_log(AP_LOG_LEVEL_ERROR,"(%s) Invalid network address \'%s\'\n",
                                       pcVar18,pcVar11);
                                uVar8 = 0xd;
                                goto LAB_00102870;
                              }
                              pcVar11 = strtok_r((char *)0x0,"/",&local_448);
                              if (pcVar11 == (char *)0x0) {
                                pcVar11 = "32";
                              }
                              uVar13 = strtoul(pcVar11,(char **)0x0,10);
                              if (0x20 < uVar13) {
                                ap_log(AP_LOG_LEVEL_ERROR,"(%s) Invalid prefix \'%s\'\n",pcVar18,
                                       pcVar11);
                                uVar8 = 0xe;
                                goto LAB_00102870;
                              }
                              uVar8 = ip_str_to_ip(&local_498,pcVar18,&ip);
                              if ((uVar8 != 0) ||
                                 (uVar8 = ip_str_to_ip(&local_498,pcVar17,&network), uVar8 != 0))
                              goto LAB_00102870;
                              uVar8 = -1 << (-(char)uVar13 & 0x1fU);
                              if (uVar13 == 0) {
                                uVar8 = 0;
                              }
                              if (((network & uVar8) <= ip) &&
                                 (pcVar17 = local_450, ip <= (network | ~uVar8))) break;
                              ap_log(AP_LOG_LEVEL_DEBUG,"(%s) IP doesn\'t match\n",pcVar18);
                              pcVar11 = (char *)0x0;
                            }
                            ap_log(AP_LOG_LEVEL_DEBUG,"(%s) IP match\n",pcVar18);
                            bVar3 = true;
                          }
                        }
                      } while ((!bVar3) || (pcVar11[sVar12 - 1] == ']'));
                      iVar6 = ap_str_match(pcVar17,pcVar11,";{}|`()&");
                      if (iVar6 != 0x10) {
                        if (iVar6 == 0) {
                          uVar15 = 0;
                          ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Command matched by config line \'%s\'\n",
                                 pcVar18,pcVar11);
                          if (local_498.simulate == '\0') {
                            uVar8 = system(pcVar17);
                            if (uVar8 == 0xffffffff) {
                              pcVar11 = "(%s) Can not execute the shell for command \'%s\'\n";
                            }
                            else {
                              uVar15 = uVar8 >> 8 & 0xff;
                              if (uVar15 != 0x7f) {
                                uVar13 = (ulong)uVar15;
                                goto LAB_00102dd1;
                              }
                              pcVar11 = 
                              "(%s) Can not execute command, shell was executed, but the command inside the shell wasn\'t \'%s\'\n"
                              ;
                            }
                            ap_log(AP_LOG_LEVEL_ERROR,pcVar11,pcVar18,pcVar17);
                            uVar8 = 10;
                            goto LAB_00102911;
                          }
                          uVar13 = 0;
LAB_00102dd1:
                          ap_log(AP_LOG_LEVEL_ALLOWED_COMMAND,
                                 "(%s) Successfully executed command \'%s\', exit code \'%d\'\n",
                                 pcVar18,pcVar17,uVar13);
                          goto LAB_0010292f;
                        }
                        ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Command doesn\'t match\n",pcVar18);
                        goto LAB_00102a07;
                      }
                      ap_log(AP_LOG_LEVEL_DEBUG,
                             "(%s) Invalid characters \'%s\' in command \'%s\', not allowed in the substring matched by \'*\'\n"
                             ,pcVar18,";{}|`()&",pcVar17);
                    } while( true );
                  }
                  piVar14 = __errno_location();
                  pcVar11 = strerror(*piVar14);
                  ap_log(AP_LOG_LEVEL_ERROR,
                         "(%s) Can not open configuration file \'%s\', error: \'%s\'\n",pcVar17,
                         pcVar18,pcVar11);
                  uVar8 = 9;
                  goto LAB_00102911;
                }
                pcVar17 = "(%s) Can not allocate memory for \'ctx->client_command\'\n";
              }
              ap_log(AP_LOG_LEVEL_ERROR,pcVar17,pcVar18);
              uVar8 = uVar15;
              goto LAB_00102870;
            }
            pcVar18 = "Invalid SSH_CLIENT variable\n";
            goto LAB_001028fa;
          }
          ap_log(AP_LOG_LEVEL_ERROR,"Can not allocate memory for \'ctx->client_ip\'\n");
          uVar8 = 4;
        }
        free(local_498.client_ip);
      }
    }
    else {
LAB_00102870:
      uVar15 = 0;
      if (uVar8 < 3) goto LAB_0010292f;
    }
  }
  goto LAB_00102911;
switchD_0010237c_caseD_6c:
  if (pcVar17[2] != '\0') goto switchD_0010237c_caseD_64;
  if (pcVar11 == (char *)0x0) {
LAB_00102880:
    local_498.simulate = BVar5;
    pcVar18 = "\'%s\' requires an argument\n";
    pcVar11 = pcVar17;
    goto LAB_001028b1;
  }
  local_498.log_path = strdup(pcVar11);
  if (local_498.log_path == (char *)0x0) {
    pcVar18 = "Cannot allocate memory for \'ctx->log_path\'\n";
    sStack_4b0 = 0x2b;
LAB_0010298c:
    local_498.simulate = BVar5;
    fwrite(pcVar18,sStack_4b0,1,_stdout);
    goto LAB_001028c0;
  }
  ppcVar16 = ppcVar16 + 1;
  BVar4 = BVar5;
  pcVar18 = local_498.log_path;
  goto LAB_00102348;
switchD_0010237c_caseD_64:
LAB_00102803:
  local_498.simulate = BVar5;
  pcVar18 = "Invalid argument \'%s\'\n";
  pcVar11 = pcVar17;
LAB_001028b1:
  fprintf(_stdout,pcVar18,pcVar11);
LAB_001028b8:
  show_help();
LAB_001028bd:
  uVar8 = 5;
LAB_001028c0:
  uninit(&local_498);
LAB_00102911:
  uVar15 = uVar8;
  fwrite("authprogs denied your access, please check the log on server (default: \'~/.ssh/authprogs.log\')\n"
         ,0x5f,1,_stderr);
LAB_0010292f:
  uninit(&local_498);
  return uVar15;
}

Assistant:

int main (int argc, char *argv[])
{
	int				rc							= AP_NO_ERROR;
	AP_CTX			ctx;
	BOOL			ip_command_match			= FALSE;
	int				exit_code;
	BOOL			exit_code_set				= FALSE;
	
	if (argv == NULL)
	{
		fprintf (stdout, "Invalid argument: argv\n");
		rc = AP_ERROR_INVALID_ARGUMENT;

		goto finish;
	}

	memset (&ctx, 0, sizeof (AP_CTX));

	rc = init (&ctx, argc, argv);
	if (rc != AP_NO_ERROR)
	{	
		goto finish;
	}

	if (ap_log_get_level () == AP_LOG_LEVEL_TRACE)
	{
		print_environment (&ctx);
	}
	
	rc = parse_config (&ctx, &ip_command_match);
	if (rc != AP_NO_ERROR)
	{
		goto finish;
	}
	
	if (ip_command_match == TRUE)
	{
		rc = run_command (&ctx, &exit_code);
		if (rc != AP_NO_ERROR)
		{
			goto finish;
		}

		exit_code_set = TRUE;
	}
	else
	{
		ap_denied ("(%s) Is not allowed to execute command '%s'\n", ctx.client_ip, ctx.client_command);
		fprintf (stderr, "(%s) Is not allowed to execute command '%s'\n", ctx.client_ip, ctx.client_command);
	}
	
finish:
	if (rc == AP_NO_ERROR)
	{
		if (exit_code_set == TRUE)
		{
			rc = exit_code;
		}
	}
	else
	{
		if (rc == AP_ERROR_VERSION || rc == AP_ERROR_HELP)
		{
			rc = AP_NO_ERROR;
		}
		else
		{
			fprintf (stderr, "authprogs denied your access, please check the log on server (default: '~/.ssh/authprogs.log')\n");
		}
	}

	uninit (&ctx);

	return rc;
}